

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O3

void __thiscall CMU462::HalfedgeMesh::computeLinearSubdivisionPositions(HalfedgeMesh *this)

{
  return;
}

Assistant:

void HalfedgeMesh::computeLinearSubdivisionPositions()
  {
    // TODO For each vertex, assign Vertex::newPosition to
    // its original position, Vertex::position.

    // TODO For each edge, assign the midpoint of the two original
    // positions to Edge::newPosition.

    // TODO For each face, assign the centroid (i.e., arithmetic mean)
    // of the original vertex positions to Face::newPosition.  Note
    // that in general, NOT all faces will be triangles!
  }